

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-basic.c
# Opt level: O0

void test_date_time(void)

{
  byte bVar1;
  undefined8 uVar2;
  int64_t iVar3;
  undefined8 uVar4;
  int64_t *piVar5;
  bson_t *bcon;
  int64_t out;
  
  uVar2 = bson_bcon_magic();
  iVar3 = bcon_ensure_int64(10000);
  uVar2 = bcon_new(0,"foo",uVar2,8,iVar3);
  uVar4 = bson_bcone_magic();
  piVar5 = bcon_ensure_int64_ptr((int64_t *)&bcon);
  bVar1 = bcon_extract(uVar2,"foo",uVar4,8,piVar5,0);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
            ,0x7a,"test_date_time","BCON_EXTRACT (bcon, \"foo\", BCONE_DATE_TIME (out))");
    abort();
  }
  if (bcon != (bson_t *)0x2710) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
            ,0x7c,"test_date_time","out == 10000");
    abort();
  }
  bson_destroy(uVar2);
  return;
}

Assistant:

static void
test_date_time (void)
{
   bson_t bcon, expected;

   bson_init (&bcon);
   bson_init (&expected);

   bson_append_date_time (&expected, "foo", -1, 10000);

   BCON_APPEND (&bcon, "foo", BCON_DATE_TIME (10000));

   bson_eq_bson (&bcon, &expected);

   bson_destroy (&bcon);
   bson_destroy (&expected);
}